

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qdockwidget.cpp
# Opt level: O0

void QDockWidget::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long lVar1;
  bool bVar2;
  QObject QVar3;
  QFlagsStorageHelper<Qt::DockWidgetArea,_4> QVar4;
  QtMocHelpers *in_RCX;
  uint in_EDX;
  int in_ESI;
  long in_FS_OFFSET;
  void *_v_1;
  void *_v;
  QDockWidget *_t;
  undefined4 in_stack_ffffffffffffff18;
  QFlagsStorage<QDockWidget::DockWidgetFeature> in_stack_ffffffffffffff1c;
  QDockWidget *in_stack_ffffffffffffff20;
  QWidget *in_stack_ffffffffffffff28;
  QWidget *pQVar5;
  QDockWidget *in_stack_ffffffffffffff30;
  QString *in_stack_ffffffffffffff38;
  code *in_stack_ffffffffffffff68;
  undefined8 in_stack_ffffffffffffffa0;
  QFlagsStorage<QDockWidget::DockWidgetFeature> features;
  
  features.i = (Int)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI == 0) {
    in_stack_ffffffffffffff38 = (QString *)(ulong)in_EDX;
    bVar2 = SUB41(in_stack_ffffffffffffff1c.i >> 0x18,0);
    switch(in_stack_ffffffffffffff38) {
    case (QString *)0x0:
      featuresChanged((QDockWidget *)0x590c1d,(DockWidgetFeatures)in_stack_ffffffffffffff1c.i);
      break;
    case (QString *)0x1:
      topLevelChanged((QDockWidget *)0x590c42,bVar2);
      break;
    case (QString *)0x2:
      allowedAreasChanged((QDockWidget *)0x590c6d,(DockWidgetAreas)in_stack_ffffffffffffff1c.i);
      break;
    case (QString *)0x3:
      visibilityChanged((QDockWidget *)0x590c8f,bVar2);
      break;
    case (QString *)0x4:
      dockLocationChanged((QDockWidget *)0x590cac,in_stack_ffffffffffffff1c.i);
    }
  }
  if (in_ESI == 5) {
    features.i = 0;
    bVar2 = QtMocHelpers::
            indexOfMethod<void(QDockWidget::*)(QFlags<QDockWidget::DockWidgetFeature>)>
                      (in_RCX,(void **)featuresChanged,0,0);
    if (((bVar2) ||
        (bVar2 = QtMocHelpers::indexOfMethod<void(QDockWidget::*)(bool)>
                           (in_RCX,(void **)topLevelChanged,0,1), bVar2)) ||
       (bVar2 = QtMocHelpers::indexOfMethod<void(QDockWidget::*)(QFlags<Qt::DockWidgetArea>)>
                          (in_RCX,(void **)allowedAreasChanged,0,2), bVar2))
    goto switchD_00590f47_default;
    in_stack_ffffffffffffff68 = visibilityChanged;
    bVar2 = QtMocHelpers::indexOfMethod<void(QDockWidget::*)(bool)>
                      (in_RCX,(void **)visibilityChanged,0,3);
    if ((bVar2) ||
       (bVar2 = QtMocHelpers::indexOfMethod<void(QDockWidget::*)(Qt::DockWidgetArea)>
                          (in_RCX,(void **)dockLocationChanged,0,4), bVar2))
    goto switchD_00590f47_default;
  }
  if (in_ESI == 1) {
    pQVar5 = *(QWidget **)in_RCX;
    in_stack_ffffffffffffff30 = (QDockWidget *)(ulong)in_EDX;
    switch(in_stack_ffffffffffffff30) {
    case (QDockWidget *)0x0:
      QVar3 = (QObject)isFloating((QDockWidget *)0x590e4e);
      pQVar5->super_QObject = QVar3;
      break;
    case (QDockWidget *)0x1:
      QDockWidget::features(in_stack_ffffffffffffff20);
      QtMocHelpers::assignFlags<QFlags<QDockWidget::DockWidgetFeature>>
                ((void *)0x590e88,
                 (QFlags<QDockWidget::DockWidgetFeature>)in_stack_ffffffffffffff1c.i);
      in_stack_ffffffffffffff28 = pQVar5;
      break;
    case (QDockWidget *)0x2:
      QVar4.super_QFlagsStorage<Qt::DockWidgetArea>.i =
           (QFlagsStorage<Qt::DockWidgetArea>)allowedAreas(in_stack_ffffffffffffff20);
      *(QFlagsStorage<Qt::DockWidgetArea> *)pQVar5 = QVar4.super_QFlagsStorage<Qt::DockWidgetArea>.i
      ;
      break;
    case (QDockWidget *)0x3:
      QWidget::windowTitle(in_stack_ffffffffffffff28);
      QString::operator=((QString *)in_stack_ffffffffffffff20,
                         (QString *)CONCAT44(in_stack_ffffffffffffff1c.i,in_stack_ffffffffffffff18))
      ;
      QString::~QString((QString *)0x590ee2);
      break;
    case (QDockWidget *)0x4:
      QVar4.super_QFlagsStorage<Qt::DockWidgetArea>.i =
           (QFlagsStorage<Qt::DockWidgetArea>)dockLocation((QDockWidget *)in_stack_ffffffffffffff28)
      ;
      *(QFlagsStorage<Qt::DockWidgetArea> *)pQVar5 = QVar4.super_QFlagsStorage<Qt::DockWidgetArea>.i
      ;
    }
  }
  if (in_ESI == 2) {
    switch((QDockWidget *)(ulong)in_EDX) {
    case (QDockWidget *)0x0:
      setFloating((QDockWidget *)(ulong)in_EDX,SUB41(in_stack_ffffffffffffff1c.i >> 0x18,0));
      break;
    case (QDockWidget *)0x1:
      setFeatures((QDockWidget *)in_stack_ffffffffffffff68,(DockWidgetFeatures)features.i);
      break;
    case (QDockWidget *)0x2:
      setAllowedAreas((QDockWidget *)in_stack_ffffffffffffff28,
                      (QFlagsStorageHelper<Qt::DockWidgetArea,_4>)
                      SUB84((ulong)in_stack_ffffffffffffff38 >> 0x20,0));
      break;
    case (QDockWidget *)0x3:
      QWidget::setWindowTitle(*(QWidget **)in_RCX,in_stack_ffffffffffffff38);
      break;
    case (QDockWidget *)0x4:
      setDockLocation(in_stack_ffffffffffffff30,
                      (DockWidgetArea)((ulong)in_stack_ffffffffffffff28 >> 0x20));
    }
  }
switchD_00590f47_default:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDockWidget::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QDockWidget *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->featuresChanged((*reinterpret_cast< std::add_pointer_t<QDockWidget::DockWidgetFeatures>>(_a[1]))); break;
        case 1: _t->topLevelChanged((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 2: _t->allowedAreasChanged((*reinterpret_cast< std::add_pointer_t<Qt::DockWidgetAreas>>(_a[1]))); break;
        case 3: _t->visibilityChanged((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 4: _t->dockLocationChanged((*reinterpret_cast< std::add_pointer_t<Qt::DockWidgetArea>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QDockWidget::*)(QDockWidget::DockWidgetFeatures )>(_a, &QDockWidget::featuresChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QDockWidget::*)(bool )>(_a, &QDockWidget::topLevelChanged, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QDockWidget::*)(Qt::DockWidgetAreas )>(_a, &QDockWidget::allowedAreasChanged, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QDockWidget::*)(bool )>(_a, &QDockWidget::visibilityChanged, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QDockWidget::*)(Qt::DockWidgetArea )>(_a, &QDockWidget::dockLocationChanged, 4))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<bool*>(_v) = _t->isFloating(); break;
        case 1: QtMocHelpers::assignFlags<DockWidgetFeatures>(_v, _t->features()); break;
        case 2: *reinterpret_cast<Qt::DockWidgetAreas*>(_v) = _t->allowedAreas(); break;
        case 3: *reinterpret_cast<QString*>(_v) = _t->windowTitle(); break;
        case 4: *reinterpret_cast<Qt::DockWidgetArea*>(_v) = _t->dockLocation(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setFloating(*reinterpret_cast<bool*>(_v)); break;
        case 1: _t->setFeatures(*reinterpret_cast<DockWidgetFeatures*>(_v)); break;
        case 2: _t->setAllowedAreas(*reinterpret_cast<Qt::DockWidgetAreas*>(_v)); break;
        case 3: _t->setWindowTitle(*reinterpret_cast<QString*>(_v)); break;
        case 4: _t->setDockLocation(*reinterpret_cast<Qt::DockWidgetArea*>(_v)); break;
        default: break;
        }
    }
}